

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O0

int ffppx(fitsfile *fptr,int datatype,long *firstpix,LONGLONG nelem,void *array,int *status)

{
  int in_ESI;
  int *in_R9;
  LONGLONG naxes [9];
  LONGLONG dimsize;
  LONGLONG firstelem;
  long group;
  int ii;
  int naxis;
  int *in_stack_ffffffffffffff58;
  int *in_stack_ffffffffffffff60;
  fitsfile *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  fitsfile *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  double *in_stack_ffffffffffffff88;
  long in_stack_ffffffffffffff90;
  fitsfile *in_stack_ffffffffffffff98;
  long in_stack_ffffffffffffffa0;
  fitsfile *fptr_00;
  int local_40;
  int local_3c;
  int local_4;
  
  fptr_00 = (fitsfile *)0x1;
  if (*in_R9 < 1) {
    ffgidm(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    ffgiszll(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
             (LONGLONG *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    for (local_40 = 0; local_40 < local_3c; local_40 = local_40 + 1) {
      fptr_00 = (fitsfile *)
                (*(long *)(&stack0xffffffffffffff58 + (long)local_40 * 8) * (long)fptr_00);
    }
    if (in_ESI == 0xb) {
      ffpprb(fptr_00,in_stack_ffffffffffffffa0,(LONGLONG)in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90,(uchar *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80)
      ;
    }
    else if (in_ESI == 0xc) {
      ffpprsb(fptr_00,in_stack_ffffffffffffffa0,(LONGLONG)in_stack_ffffffffffffff98,
              in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80)
      ;
    }
    else if (in_ESI == 0x14) {
      ffpprui(fptr_00,in_stack_ffffffffffffffa0,(LONGLONG)in_stack_ffffffffffffff98,
              in_stack_ffffffffffffff90,(unsigned_short *)in_stack_ffffffffffffff88,
              in_stack_ffffffffffffff80);
    }
    else if (in_ESI == 0x15) {
      ffppri(fptr_00,in_stack_ffffffffffffffa0,(LONGLONG)in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90,(short *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80)
      ;
    }
    else if (in_ESI == 0x1e) {
      ffppruk(fptr_00,in_stack_ffffffffffffffa0,(LONGLONG)in_stack_ffffffffffffff98,
              in_stack_ffffffffffffff90,(uint *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80)
      ;
    }
    else if (in_ESI == 0x1f) {
      ffpprk(fptr_00,in_stack_ffffffffffffffa0,(LONGLONG)in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
    else if (in_ESI == 0x28) {
      ffppruj(fptr_00,in_stack_ffffffffffffffa0,(LONGLONG)in_stack_ffffffffffffff98,
              in_stack_ffffffffffffff90,(unsigned_long *)in_stack_ffffffffffffff88,
              in_stack_ffffffffffffff80);
    }
    else if (in_ESI == 0x29) {
      ffpprj(fptr_00,in_stack_ffffffffffffffa0,(LONGLONG)in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90,(long *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
    else if (in_ESI == 0x50) {
      ffpprujj(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               (LONGLONG)in_stack_ffffffffffffff88,(LONGLONG)in_stack_ffffffffffffff80,
               (ULONGLONG *)in_stack_ffffffffffffff78,
               (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
    else if (in_ESI == 0x51) {
      ffpprjj(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
              (LONGLONG)in_stack_ffffffffffffff88,(LONGLONG)in_stack_ffffffffffffff80,
              (LONGLONG *)in_stack_ffffffffffffff78,
              (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
    else if (in_ESI == 0x2a) {
      ffppre(fptr_00,in_stack_ffffffffffffffa0,(LONGLONG)in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90,(float *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80)
      ;
    }
    else if (in_ESI == 0x52) {
      ffpprd(fptr_00,in_stack_ffffffffffffffa0,(LONGLONG)in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
    else {
      *in_R9 = 0x19a;
    }
    local_4 = *in_R9;
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffppx(  fitsfile *fptr,  /* I - FITS file pointer                       */
            int  datatype,   /* I - datatype of the value                   */
            long  *firstpix, /* I - coord of  first pixel to write(1 based) */
            LONGLONG  nelem,     /* I - number of values to write               */
            void  *array,    /* I - array of values that are written        */
            int  *status)    /* IO - error status                           */
/*
  Write an array of pixels to the primary array.  The datatype of the
  input array is defined by the 2nd argument. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written). 
  
  This routine is simillar to ffppr, except it supports writing to 
  large images with more than 2**31 pixels.
*/
{
    int naxis, ii;
    long group = 1;
    LONGLONG firstelem, dimsize = 1, naxes[9];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);
    ffgiszll(fptr, 9, naxes, status);

    firstelem = 0;
    for (ii=0; ii < naxis; ii++)
    {
        firstelem += ((firstpix[ii] - 1) * dimsize);
        dimsize *= naxes[ii];
    }
    firstelem++;

    if (datatype == TBYTE)
    {
      ffpprb(fptr, group, firstelem, nelem, (unsigned char *) array, status);
    }
    else if (datatype == TSBYTE)
    {
      ffpprsb(fptr, group, firstelem, nelem, (signed char *) array, status);
    }
    else if (datatype == TUSHORT)
    {
      ffpprui(fptr, group, firstelem, nelem, (unsigned short *) array,
              status);
    }
    else if (datatype == TSHORT)
    {
      ffppri(fptr, group, firstelem, nelem, (short *) array, status);
    }
    else if (datatype == TUINT)
    {
      ffppruk(fptr, group, firstelem, nelem, (unsigned int *) array, status);
    }
    else if (datatype == TINT)
    {
      ffpprk(fptr, group, firstelem, nelem, (int *) array, status);
    }
    else if (datatype == TULONG)
    {
      ffppruj(fptr, group, firstelem, nelem, (unsigned long *) array, status);
    }
    else if (datatype == TLONG)
    {
      ffpprj(fptr, group, firstelem, nelem, (long *) array, status);
    }
    else if (datatype == TULONGLONG)
    {
      ffpprujj(fptr, group, firstelem, nelem, (ULONGLONG *) array, status);
    }
    else if (datatype == TLONGLONG)
    {
      ffpprjj(fptr, group, firstelem, nelem, (LONGLONG *) array, status);
    }
    else if (datatype == TFLOAT)
    {
      ffppre(fptr, group, firstelem, nelem, (float *) array, status);
    }
    else if (datatype == TDOUBLE)
    {
      ffpprd(fptr, group, firstelem, nelem, (double *) array, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}